

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuadsPacked
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  deRandom rnd;
  
  uVar9 = (ulong)(uint)count;
  iVar6 = 4;
  if (stride != 0) {
    iVar6 = stride;
  }
  iVar15 = 0;
  iVar12 = iVar6 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar12 = 0;
  }
  pcVar5 = (char *)operator_new__((long)(componentCount + offset + iVar6 * 5 + (count + -1) * iVar12
                                        ));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    if (count < 1) {
      uVar9 = 0;
    }
    while (bVar16 = uVar9 != 0, uVar9 = uVar9 - 1, bVar16) {
      dVar1 = deRandom_getUint32(&rnd);
      uVar7 = dVar1 % 0x3f6 + 10;
      dVar2 = deRandom_getUint32(&rnd);
      uVar13 = dVar2 % (0x3f6 - dVar1 % 0x3f6) + 10;
      dVar1 = deRandom_getUint32(&rnd);
      dVar2 = deRandom_getUint32(&rnd);
      dVar3 = deRandom_getUint32(&rnd);
      dVar4 = deRandom_getUint32(&rnd);
      uVar14 = (dVar3 % 0x3f6) * 0x100000 + 0xa00000 | dVar4 << 0x1e;
      uVar10 = (dVar1 % 0x3f6) * 0x400 + 0x2800 | uVar14;
      uVar11 = uVar10 | uVar13;
      uVar14 = (dVar2 % (0x3f6 - dVar1 % 0x3f6)) * 0x400 + 0x2800 | uVar14;
      uVar8 = uVar7 | uVar14;
      *(uint *)(pcVar5 + (long)iVar15 + (long)offset) = uVar10 | uVar7;
      *(uint *)(pcVar5 + (long)(iVar6 + iVar15) + (long)offset) = uVar11;
      *(uint *)(pcVar5 + (long)(iVar6 * 2 + iVar15) + (long)offset) = uVar8;
      *(uint *)(pcVar5 + (long)(iVar6 * 3 + iVar15) + (long)offset) = uVar8;
      *(uint *)(pcVar5 + (long)(iVar6 * 4 + iVar15) + (long)offset) = uVar11;
      *(uint *)(pcVar5 + (long)(iVar6 * 5 + iVar15) + (long)offset) = uVar14 | uVar13;
      iVar15 = iVar15 + iVar12;
    }
  }
  return pcVar5;
}

Assistant:

char* RandomArrayGenerator::createQuadsPacked (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive)
{
	DE_ASSERT(componentCount == 4);
	DE_UNREF(componentCount);
	int quadStride = 0;

	if (stride == 0)
		stride = sizeof(deUint32);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* const _data		= new char[offset + quadStride * (count - 1) + stride * 5 + componentCount * Array::inputTypeSize(Array::INPUTTYPE_INT_2_10_10_10)]; // last element must be fully in the array
	char* const resultData	= _data + offset;

	const deUint32 max		= 1024;
	const deUint32 min		= 10;
	const deUint32 max2		= 4;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			for (int quadNdx = 0; quadNdx < count; quadNdx++)
			{
				deUint32 x1	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 x2	= min + deRandom_getUint32(&rnd) % (max - x1);

				deUint32 y1	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 y2	= min + deRandom_getUint32(&rnd) % (max - y1);

				deUint32 z	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 w	= deRandom_getUint32(&rnd) % max2;

				deUint32 val1 = (w << 30) | (z << 20) | (y1 << 10) | x1;
				deUint32 val2 = (w << 30) | (z << 20) | (y1 << 10) | x2;
				deUint32 val3 = (w << 30) | (z << 20) | (y2 << 10) | x1;

				deUint32 val4 = (w << 30) | (z << 20) | (y2 << 10) | x1;
				deUint32 val5 = (w << 30) | (z << 20) | (y1 << 10) | x2;
				deUint32 val6 = (w << 30) | (z << 20) | (y2 << 10) | x2;

				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 0]), val1);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 1]), val2);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 2]), val3);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 3]), val4);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 4]), val5);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 5]), val6);
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}